

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford_test.cpp
# Opt level: O2

void benchmark(Graph *g,int times)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  clock_t cVar4;
  unsigned_long i;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  ulong __n;
  int s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> pred;
  vector<unsigned_long,_std::allocator<unsigned_long>_> b_pred;
  WeightMap weight_pmap;
  vector<long,_std::allocator<long>_> dist;
  vector<int,_std::allocator<int>_> b_dist;
  allocator_type local_b1;
  clock_t local_b0;
  Graph *local_a8;
  value_type_conflict2 local_a0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  WeightMap local_68;
  _Vector_base<long,_std::allocator<long>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"[i] ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,times);
  poVar3 = std::operator<<(poVar3," time(s)");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_68.tag = 0;
  __n = (long)(g->super_type).m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(g->super_type).m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_80._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7fff;
  local_a8 = g;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,(value_type_conflict3 *)&local_80,
             (allocator_type *)&local_98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,__n,
             (allocator_type *)&local_98);
  local_b0 = clock();
  uVar6 = 0;
  uVar8 = 0;
  if (0 < times) {
    uVar8 = times;
  }
  for (; uVar7 = uVar8, uVar6 != uVar8; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
      *(ulong *)(CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_80._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar5 * 8) =
           uVar5;
    }
    iVar2 = 0;
    if (times != 1) {
      iVar2 = randomRange(0,(int)__n);
    }
    local_48._M_impl.super__Vector_impl_data._M_start[iVar2] = 0;
    bVar1 = boost::
            bellman_ford_shortest_paths<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,int,boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,EdgeProperties,int_EdgeProperties::*>,unsigned_long*,int*,boost::closed_plus<int>,std::less<int>,boost::bellman_visitor<boost::null_visitor>>
                      (local_a8,__n & 0xffffffff,0,
                       CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_80._M_impl.super__Vector_impl_data._M_start._0_4_),
                       local_48._M_impl.super__Vector_impl_data._M_start,0x7fffffff);
    uVar7 = uVar6;
    if (!bVar1) break;
  }
  cVar4 = clock();
  poVar9 = (ostream *)&std::cout;
  std::operator<<((ostream *)&std::cout,"      Average time boost: ");
  poVar3 = std::ostream::_M_insert<double>
                     (((double)(cVar4 - local_b0) / 1000000.0) / (double)(int)(uVar7 + 1));
  std::operator<<(poVar3," seconds");
  if ((int)uVar6 < times) {
    poVar9 = std::operator<<((ostream *)&std::cout," (negative cycle)");
  }
  std::endl<char,std::char_traits<char>>(poVar9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,__n,
             (allocator_type *)&local_60);
  local_a0 = 0x7fff;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_60,__n,&local_a0,&local_b1);
  local_b0 = clock();
  while (bVar1 = uVar8 != 0, uVar8 = uVar8 - 1, bVar1) {
    iVar2 = 0;
    if (times != 1) {
      iVar2 = randomRange(0,(int)__n);
    }
    local_a0 = CONCAT44(local_a0._4_4_,iVar2);
    bVar1 = bellmanFord(local_a8,(int *)&local_a0,&local_68,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                        (vector<long,_std::allocator<long>_> *)&local_60);
    uVar6 = (uint)bVar1;
  }
  cVar4 = clock();
  poVar9 = (ostream *)&std::cout;
  std::operator<<((ostream *)&std::cout,"      Average time rafa: ");
  poVar3 = std::ostream::_M_insert<double>(((double)(cVar4 - local_b0) / 1000000.0) / (double)times)
  ;
  std::operator<<(poVar3," seconds");
  if ((uVar6 & 1) == 0) {
    poVar9 = std::operator<<((ostream *)&std::cout," (negative cycle)");
  }
  std::endl<char,std::char_traits<char>>(poVar9);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_80);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void benchmark(Graph g, int times)
{
    std::cout << "[i] " << times << " time(s)" << std::endl;
    int i;
    // setup
    unsigned long  N = num_vertices(g);

    // **************************************************** BOOST
    // init
    WeightMap weight_pmap = get(&EdgeProperties::weight, g);
    std::vector<int> b_dist(N, (std::numeric_limits < short >::max)());
    std::vector<std::size_t> b_pred(N);
    // run
    bool r_boost;
    clock_t begin = clock();
    for(i = 0; i<times ; ++i){
        for (unsigned long i = 0; i < N; ++i) b_pred[i] = i;
        int s = (times == 1) ? 0 : randomRange(0, (int)N);
        b_dist[s] = 0;
        r_boost = boost::bellman_ford_shortest_paths(
            g, int(N), weight_pmap, 
            &b_pred[0], &b_dist[0], 
            boost::closed_plus<int>(),
            std::less<int>(), 
            boost::default_bellman_visitor());
        if(!r_boost) break;
    }    
    clock_t end = clock();
    double elapsed_secs_boost = double(end-begin) / CLOCKS_PER_SEC / (i+1);
    // Info
    std::cout << "      Average time boost: " << elapsed_secs_boost << " seconds";
    if(!r_boost) std::cout << " (negative cycle)" << std::endl;
    else std::cout << std::endl;


    // **************************************************** RAFA
    // init
    std::vector<unsigned long> pred(N);
    std::vector<long> dist(N, (std::numeric_limits < short >::max)());
    // run
    begin = clock();
    bool r_rafa;
    for(i = 0; i<times ; ++i) {
        int s = (times == 1) ? 0 : randomRange(0, (int)N);
        r_rafa = bellmanFord(g, s, weight_pmap, pred, dist);
    }
    end = clock();
    double elapsed_secs_rafa = double(end - begin) / CLOCKS_PER_SEC / times;
    // Info
    std::cout << "      Average time rafa: " << elapsed_secs_rafa << " seconds";
    if(!r_rafa) std::cout << " (negative cycle)" << std::endl;
    else std::cout << std::endl;
}